

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_move16_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint index_00;
  uint32_t val;
  TCGv_i32 src;
  TCGv_i32 dst;
  TCGv_i32 addr;
  TCGv_i32 reg;
  int index;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  index_00 = (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1);
  src = get_areg(s,insn & 7);
  val = read_im32(env,s);
  dst = tcg_const_i32_m68k(tcg_ctx_00,val);
  if (((int)(uint)insn >> 3 & 1U) == 0) {
    m68k_copy_line(tcg_ctx_00,dst,src,index_00);
  }
  else {
    m68k_copy_line(tcg_ctx_00,src,dst,index_00);
  }
  tcg_temp_free_i32(tcg_ctx_00,dst);
  if (((int)(uint)insn >> 3 & 2U) == 0) {
    tcg_gen_addi_i32_m68k(tcg_ctx_00,src,src,0x10);
  }
  return;
}

Assistant:

DISAS_INSN(move16_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int index = IS_USER(s);
    TCGv reg, addr;

    reg = AREG(insn, 0);
    addr = tcg_const_i32(tcg_ctx, read_im32(env, s));

    if ((insn >> 3) & 1) {
        /* MOVE16 (xxx).L, (Ay) */
        m68k_copy_line(tcg_ctx, reg, addr, index);
    } else {
        /* MOVE16 (Ay), (xxx).L */
        m68k_copy_line(tcg_ctx, addr, reg, index);
    }

    tcg_temp_free(tcg_ctx, addr);

    if (((insn >> 3) & 2) == 0) {
        /* (Ay)+ */
        tcg_gen_addi_i32(tcg_ctx, reg, reg, 16);
    }
}